

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

uint __thiscall llvm::APInt::getBitsNeeded(APInt *this,StringRef str,uint8_t radix)

{
  uint8_t radix_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint local_b0;
  uint local_a8;
  uint local_a0;
  undefined1 auStack_88 [4];
  uint log;
  iterator local_80;
  undefined1 local_78 [8];
  APInt tmp;
  uint sufficient;
  uint isNegative;
  iterator p;
  size_t slen;
  undefined1 auStack_48 [7];
  uint8_t radix_local;
  StringRef str_local;
  
  p = str.Data;
  radix_00 = (uint8_t)str.Length;
  _auStack_48 = this;
  str_local.Data = p;
  if (p == (char *)0x0) {
    __assert_fail("!str.empty() && \"Invalid string length\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x1b9,"static unsigned int llvm::APInt::getBitsNeeded(StringRef, uint8_t)");
  }
  if ((((radix_00 == '\n') || (radix_00 == '\b')) || (radix_00 == '\x10')) ||
     ((radix_00 == '\x02' || (bVar1 = false, radix_00 == '$')))) {
    bVar1 = true;
  }
  if (!bVar1) {
    __assert_fail("(radix == 10 || radix == 8 || radix == 16 || radix == 2 || radix == 36) && \"Radix should be 2, 8, 10, 16, or 36!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x1bc,"static unsigned int llvm::APInt::getBitsNeeded(StringRef, uint8_t)");
  }
  _sufficient = StringRef::begin((StringRef *)auStack_48);
  tmp._12_4_ = ZEXT14(*_sufficient == '-');
  if ((*_sufficient == '-') || (*_sufficient == '+')) {
    _sufficient = _sufficient + 1;
    p = p + -1;
    if (p == (char *)0x0) {
      __assert_fail("slen && \"String is only a sign, needs a value.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x1c6,"static unsigned int llvm::APInt::getBitsNeeded(StringRef, uint8_t)");
    }
  }
  if (radix_00 == '\x02') {
    str_local.Length._4_4_ = (int)p + tmp._12_4_;
  }
  else if (radix_00 == '\b') {
    str_local.Length._4_4_ = (int)p * 3 + tmp._12_4_;
  }
  else if (radix_00 == '\x10') {
    str_local.Length._4_4_ = (int)((long)p << 2) + tmp._12_4_;
  }
  else {
    if (radix_00 == '\n') {
      if (p == (iterator)0x1) {
        local_a0 = 4;
      }
      else {
        local_a0 = (uint)((ulong)((long)p << 6) / 0x12);
      }
      local_a8 = local_a0;
    }
    else {
      if (p == (iterator)0x1) {
        local_b0 = 7;
      }
      else {
        local_b0 = (uint)((ulong)((long)p << 4) / 3);
      }
      local_a8 = local_b0;
    }
    tmp.BitWidth = local_a8;
    _auStack_88 = _sufficient;
    local_80 = p;
    APInt((APInt *)local_78,local_a8,_auStack_88,radix_00);
    uVar3 = logBase2((APInt *)local_78);
    iVar2 = tmp._12_4_;
    if (uVar3 != 0xffffffff) {
      iVar2 = tmp._12_4_ + uVar3;
    }
    str_local.Length._4_4_ = iVar2 + 1;
    ~APInt((APInt *)local_78);
  }
  return str_local.Length._4_4_;
}

Assistant:

unsigned APInt::getBitsNeeded(StringRef str, uint8_t radix) {
  assert(!str.empty() && "Invalid string length");
  assert((radix == 10 || radix == 8 || radix == 16 || radix == 2 ||
          radix == 36) &&
         "Radix should be 2, 8, 10, 16, or 36!");

  size_t slen = str.size();

  // Each computation below needs to know if it's negative.
  StringRef::iterator p = str.begin();
  unsigned isNegative = *p == '-';
  if (*p == '-' || *p == '+') {
    p++;
    slen--;
    assert(slen && "String is only a sign, needs a value.");
  }

  // For radixes of power-of-two values, the bits required is accurately and
  // easily computed
  if (radix == 2)
    return slen + isNegative;
  if (radix == 8)
    return slen * 3 + isNegative;
  if (radix == 16)
    return slen * 4 + isNegative;

  // FIXME: base 36

  // This is grossly inefficient but accurate. We could probably do something
  // with a computation of roughly slen*64/20 and then adjust by the value of
  // the first few digits. But, I'm not sure how accurate that could be.

  // Compute a sufficient number of bits that is always large enough but might
  // be too large. This avoids the assertion in the constructor. This
  // calculation doesn't work appropriately for the numbers 0-9, so just use 4
  // bits in that case.
  unsigned sufficient
    = radix == 10? (slen == 1 ? 4 : slen * 64/18)
                 : (slen == 1 ? 7 : slen * 16/3);

  // Convert to the actual binary value.
  APInt tmp(sufficient, StringRef(p, slen), radix);

  // Compute how many bits are required. If the log is infinite, assume we need
  // just bit.
  unsigned log = tmp.logBase2();
  if (log == (unsigned)-1) {
    return isNegative + 1;
  } else {
    return isNegative + log + 1;
  }
}